

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar1;
  const_reference pvVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configNames;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_
                      (&this->LocalGenerator->super_cmLocalCommonGenerator);
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(this_00);
  if (sVar1 == 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(this_00);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
    return __return_storage_ptr__;
  }
  __assert_fail("configNames.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefileTargetGenerator.cxx"
                ,0x73,"std::string cmMakefileTargetGenerator::GetConfigName() const");
}

Assistant:

std::string cmMakefileTargetGenerator::GetConfigName() const
{
  auto const& configNames = this->LocalGenerator->GetConfigNames();
  assert(configNames.size() == 1);
  return configNames.front();
}